

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__encode_png_line
               (uchar *pixels,int stride_bytes,int width,int height,int y,int n,int filter_type,
               char *line_buffer)

{
  uchar uVar1;
  int iVar2;
  uchar uVar3;
  int *piVar4;
  uchar *__src;
  int local_58;
  int local_54;
  int signed_stride;
  uchar *z;
  int type;
  int i;
  int *mymap;
  int n_local;
  int y_local;
  int height_local;
  int width_local;
  int stride_bytes_local;
  uchar *pixels_local;
  
  piVar4 = stbiw__encode_png_line::firstmap;
  if (y != 0) {
    piVar4 = stbiw__encode_png_line::mapping;
  }
  iVar2 = piVar4[filter_type];
  local_54 = y;
  if (stbi__flip_vertically_on_write != 0) {
    local_54 = (height + -1) - y;
  }
  __src = pixels + stride_bytes * local_54;
  local_58 = stride_bytes;
  if (stbi__flip_vertically_on_write != 0) {
    local_58 = -stride_bytes;
  }
  if (iVar2 == 0) {
    memcpy(line_buffer,__src,(long)(width * n));
  }
  else {
    for (z._4_4_ = 0; z._4_4_ < n; z._4_4_ = z._4_4_ + 1) {
      switch(iVar2) {
      case 1:
        line_buffer[z._4_4_] = __src[z._4_4_];
        break;
      case 2:
        line_buffer[z._4_4_] = __src[z._4_4_] - __src[z._4_4_ - local_58];
        break;
      case 3:
        line_buffer[z._4_4_] = __src[z._4_4_] - (char)((int)(uint)__src[z._4_4_ - local_58] >> 1);
        break;
      case 4:
        uVar1 = __src[z._4_4_];
        uVar3 = stbiw__paeth(0,(uint)__src[z._4_4_ - local_58],0);
        line_buffer[z._4_4_] = uVar1 - uVar3;
        break;
      case 5:
        line_buffer[z._4_4_] = __src[z._4_4_];
        break;
      case 6:
        line_buffer[z._4_4_] = __src[z._4_4_];
      }
    }
    z._4_4_ = n;
    switch(iVar2) {
    case 1:
      for (; z._4_4_ < width * n; z._4_4_ = z._4_4_ + 1) {
        line_buffer[z._4_4_] = __src[z._4_4_] - __src[z._4_4_ - n];
      }
      break;
    case 2:
      for (; z._4_4_ < width * n; z._4_4_ = z._4_4_ + 1) {
        line_buffer[z._4_4_] = __src[z._4_4_] - __src[z._4_4_ - local_58];
      }
      break;
    case 3:
      for (; z._4_4_ < width * n; z._4_4_ = z._4_4_ + 1) {
        line_buffer[z._4_4_] =
             __src[z._4_4_] -
             (char)((int)((uint)__src[z._4_4_ - n] + (uint)__src[z._4_4_ - local_58]) >> 1);
      }
      break;
    case 4:
      for (; z._4_4_ < width * n; z._4_4_ = z._4_4_ + 1) {
        uVar1 = __src[z._4_4_];
        uVar3 = stbiw__paeth((uint)__src[z._4_4_ - n],(uint)__src[z._4_4_ - local_58],
                             (uint)__src[(z._4_4_ - local_58) - n]);
        line_buffer[z._4_4_] = uVar1 - uVar3;
      }
      break;
    case 5:
      for (; z._4_4_ < width * n; z._4_4_ = z._4_4_ + 1) {
        line_buffer[z._4_4_] = __src[z._4_4_] - (char)((int)(uint)__src[z._4_4_ - n] >> 1);
      }
      break;
    case 6:
      for (; z._4_4_ < width * n; z._4_4_ = z._4_4_ + 1) {
        uVar1 = __src[z._4_4_];
        uVar3 = stbiw__paeth((uint)__src[z._4_4_ - n],0,0);
        line_buffer[z._4_4_] = uVar1 - uVar3;
      }
    }
  }
  return;
}

Assistant:

static void stbiw__encode_png_line(unsigned char *pixels, int stride_bytes, int width, int height, int y, int n, int filter_type, signed char *line_buffer)
{
   static int mapping[] = { 0,1,2,3,4 };
   static int firstmap[] = { 0,1,0,5,6 };
   int *mymap = (y != 0) ? mapping : firstmap;
   int i;
   int type = mymap[filter_type];
   unsigned char *z = pixels + stride_bytes * (stbi__flip_vertically_on_write ? height-1-y : y);
   int signed_stride = stbi__flip_vertically_on_write ? -stride_bytes : stride_bytes;
    
   if (type==0) {
      memcpy(line_buffer, z, width*n);
      return;
   }

   // first loop isn't optimized since it's just one pixel    
   for (i = 0; i < n; ++i) {
      switch (type) {
         case 1: line_buffer[i] = z[i]; break;
         case 2: line_buffer[i] = z[i] - z[i-signed_stride]; break;
         case 3: line_buffer[i] = z[i] - (z[i-signed_stride]>>1); break;
         case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-signed_stride],0)); break;
         case 5: line_buffer[i] = z[i]; break;
         case 6: line_buffer[i] = z[i]; break;
      }
   }
   switch (type) {
      case 1: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-n]; break;
      case 2: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-signed_stride]; break;
      case 3: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - ((z[i-n] + z[i-signed_stride])>>1); break;
      case 4: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-signed_stride], z[i-signed_stride-n]); break;
      case 5: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - (z[i-n]>>1); break;
      case 6: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
   }
}